

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O2

void __thiscall
ConditionalEstimator::setParameter(ConditionalEstimator *this,Property *p,double value)

{
  double dVar1;
  int iVar2;
  double **ppdVar3;
  double *pdVar4;
  ulong uVar5;
  int i_1;
  int i;
  long lVar6;
  long lVar7;
  
  iVar2 = *p;
  if (iVar2 == 3) {
    this->nDist = (int)value;
  }
  else if (iVar2 == 2) {
    this->aDistRange[1] = value;
  }
  else {
    if (iVar2 != 1) {
      return;
    }
    this->aDistRange[0] = value;
  }
  lVar7 = (long)this->nPost + (long)this->nPre;
  if (this->aDist != (double **)0x0) {
    for (lVar6 = 0; ppdVar3 = this->aDist, lVar6 <= lVar7; lVar6 = lVar6 + 1) {
      if (ppdVar3[lVar6] != (double *)0x0) {
        operator_delete__(ppdVar3[lVar6]);
      }
    }
    if (ppdVar3 != (double **)0x0) {
      operator_delete__(ppdVar3);
    }
  }
  dVar1 = this->aDistRange[1];
  this->dDistOffset = this->aDistRange[0];
  iVar2 = this->nDist;
  this->dDistScale = (dVar1 - this->aDistRange[0]) / (double)iVar2;
  uVar5 = (long)((int)lVar7 + 1) << 3;
  if ((int)lVar7 < -1) {
    uVar5 = 0xffffffffffffffff;
  }
  ppdVar3 = (double **)operator_new__(uVar5);
  this->aDist = ppdVar3;
  uVar5 = (long)iVar2 * 8;
  if ((long)iVar2 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  for (lVar6 = 0; lVar6 <= lVar7; lVar6 = lVar6 + 1) {
    pdVar4 = (double *)operator_new__(uVar5);
    this->aDist[lVar6] = pdVar4;
  }
  return;
}

Assistant:

void ConditionalEstimator::setParameter( const Property& p, double value )
{
	// assign parameter
	if (p==EST_DIST_MIN)
		aDistRange[0] = value;
	else if (p==EST_DIST_MAX)
		aDistRange[1] = value;
	else if (p==EST_DIST_BINS)
		nDist = (int)value;
	else return;
	
	// re-generate distribution
	int size = nPre+nPost+1;
	if (aDist) {
		for( int i=0; i<size; i++ )
			if (aDist[i])
				delete[] aDist[i];
		delete[] aDist;
	}
	dDistOffset = double(aDistRange[0]);
	dDistScale = (double(aDistRange[1]) - double(aDistRange[0])) / double(nDist);
	aDist = new double *[size];
	for( int i=0; i<size; i++ )
		aDist[i] = new double[nDist];
}